

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-opt.cpp
# Opt level: O1

void helper_after_test_gradient_accumulation
               (char *func,int nbatch_physical,ggml_opt_loss_type loss_type,int epoch,
               string *subtest,bool subtest_ok,int *ntest,int *npass)

{
  uint uVar1;
  uint uVar2;
  undefined4 in_register_0000000c;
  ulong uVar3;
  ggml_opt_loss_type __val;
  uint uVar4;
  undefined7 in_register_00000089;
  uint uVar5;
  uint uVar6;
  string options;
  long *local_c8 [2];
  long local_b8 [2];
  undefined4 local_a4;
  long *local_a0;
  long local_98;
  long local_90 [2];
  int *local_80;
  long *local_78;
  string local_70;
  string local_50;
  
  local_80 = (int *)CONCAT71(in_register_00000089,subtest_ok);
  local_78 = (long *)CONCAT44(in_register_0000000c,epoch);
  local_a4 = SUB84(subtest,0);
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,", nbatch_physical=","");
  uVar6 = (uint)func;
  uVar5 = -uVar6;
  if (0 < (int)uVar6) {
    uVar5 = uVar6;
  }
  uVar4 = 1;
  if (9 < uVar5) {
    uVar3 = (ulong)uVar5;
    uVar1 = 4;
    do {
      uVar4 = uVar1;
      uVar2 = (uint)uVar3;
      if (uVar2 < 100) {
        uVar4 = uVar4 - 2;
        goto LAB_00107821;
      }
      if (uVar2 < 1000) {
        uVar4 = uVar4 - 1;
        goto LAB_00107821;
      }
      if (uVar2 < 10000) goto LAB_00107821;
      uVar3 = uVar3 / 10000;
      uVar1 = uVar4 + 4;
    } while (99999 < uVar2);
    uVar4 = uVar4 + 1;
  }
LAB_00107821:
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct
            ((ulong)local_c8,(char)uVar4 - ((char)((ulong)func >> 0x18) >> 7));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar6 >> 0x1f) + (long)local_c8[0]),uVar4,uVar5);
  std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c8[0]);
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  std::__cxx11::string::append((char *)&local_a0);
  std::__cxx11::string::append((char *)&local_a0);
  std::__cxx11::string::append((char *)&local_a0);
  __val = -loss_type;
  if (0 < (int)loss_type) {
    __val = loss_type;
  }
  uVar5 = 1;
  if (9 < __val) {
    uVar3 = (ulong)__val;
    uVar6 = 4;
    do {
      uVar5 = uVar6;
      uVar4 = (uint)uVar3;
      if (uVar4 < 100) {
        uVar5 = uVar5 - 2;
        goto LAB_0010791c;
      }
      if (uVar4 < 1000) {
        uVar5 = uVar5 - 1;
        goto LAB_0010791c;
      }
      if (uVar4 < 10000) goto LAB_0010791c;
      uVar3 = uVar3 / 10000;
      uVar6 = uVar5 + 4;
    } while (99999 < uVar4);
    uVar5 = uVar5 + 1;
  }
LAB_0010791c:
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct((ulong)local_c8,(char)uVar5 - (char)((int)loss_type >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(loss_type >> 0x1f) + (long)local_c8[0]),uVar5,__val);
  std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c8[0]);
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_a0,local_98 + (long)local_a0);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,*local_78,local_78[1] + *local_78);
  helper_after_test("test_gradient_accumulation",false,&local_70,&local_50,local_a4._0_1_,local_80,
                    ntest);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  return;
}

Assistant:

static void helper_after_test_gradient_accumulation(
        const char * func, const int nbatch_physical, const enum ggml_opt_loss_type loss_type, const int epoch,
        const std::string subtest, const bool subtest_ok, int & ntest, int & npass) {
    std::string options = ", nbatch_physical=";
    options += std::to_string(nbatch_physical);
    options += ", loss_type=";
    options += loss_type == GGML_OPT_LOSS_TYPE_MEAN ? "mean" : "sum";
    options += ", epoch=";
    options += std::to_string(epoch);
    helper_after_test(func, false, options, subtest, subtest_ok, ntest, npass);
}